

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O0

bool __thiscall
gl3cts::TransformFeedback::QueryVertexInterleaved::checkTransformFeedbackBuffer
          (QueryVertexInterleaved *this,BindBufferCase bind_case,GLenum primitive_type)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  int local_2c;
  GLuint number_of_primitives_reference;
  GLuint number_of_primitives;
  Functions *gl;
  GLenum primitive_type_local;
  BindBufferCase bind_case_local;
  QueryVertexInterleaved *this_local;
  
  gl._0_4_ = primitive_type;
  gl._4_4_ = bind_case;
  _primitive_type_local = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_CaptureVertexInterleaved).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  _number_of_primitives_reference = CONCAT44(extraout_var,iVar1);
  (**(code **)(_number_of_primitives_reference + 0xa20))(this->m_query_object,0x8866,&local_2c);
  err = (**(code **)(_number_of_primitives_reference + 0x800))();
  glu::checkError(err,"glGetQueryObjectuiv call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                  ,0xf2f);
  iVar1 = 1;
  if ((GLenum)gl == 0) {
    iVar1 = 3;
  }
  return iVar1 == local_2c;
}

Assistant:

bool gl3cts::TransformFeedback::QueryVertexInterleaved::checkTransformFeedbackBuffer(BindBufferCase bind_case UNUSED,
																					 glw::GLenum primitive_type)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	glw::GLuint number_of_primitives;

	gl.getQueryObjectuiv(m_query_object, GL_QUERY_RESULT, &number_of_primitives);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGetQueryObjectuiv call failed.");

	/* expected result */
	glw::GLuint number_of_primitives_reference = (primitive_type == GL_POINTS) ? 3 : 1; /* m_max_vertices_drawn == 3 */

	if (number_of_primitives_reference != number_of_primitives)
	{
		return false;
	}

	return true;
}